

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator fmt::v6::
         format_to<fmt::v6::basic_string_view<char>,long_const&,unsigned_long_const&,250ul,char>
                   (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *buf,
                   basic_string_view<char> *format_str,long *args,unsigned_long *args_1)

{
  iterator iVar1;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args_00;
  long local_28 [2];
  unsigned_long local_18;
  
  local_28[0] = *args;
  local_18 = *args_1;
  args_00.field_1.values_ =
       (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
        *)local_28;
  args_00.types_ = 0xa4;
  iVar1 = internal::vformat_to<char>(&buf->super_buffer<char>,*format_str,args_00);
  return (iterator)iVar1.container;
}

Assistant:

inline typename buffer_context<Char>::iterator format_to(
    basic_memory_buffer<Char, SIZE>& buf, const S& format_str, Args&&... args) {
  internal::check_format_string<Args...>(format_str);
  using context = buffer_context<Char>;
  return internal::vformat_to(buf, to_string_view(format_str),
                              {make_format_args<context>(args...)});
}